

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

ssize_t __thiscall
ritobin::io::text_write_impl::TextWriter::write(TextWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  size_t i;
  long lVar1;
  
  this->ident_ = this->ident_ + this->indent_size_;
  write_raw<3ul>(this,(char (*) [3])"{\n");
  pad(this);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    write<float>(this,*(float *)(CONCAT44(in_register_00000034,__fd) + lVar1 * 4));
    if ((~(uint)lVar1 & 3) == 0) {
      write_raw<2ul>(this,(char (*) [2])0x1313bf);
      if (lVar1 == 0xf) {
        this->ident_ = this->ident_ - this->indent_size_;
      }
      pad(this);
    }
    else {
      write_raw<3ul>(this,(char (*) [3])", ");
    }
  }
  write_raw<2ul>(this,(char (*) [2])0x131b39);
  return extraout_RAX;
}

Assistant:

void write(std::array<float, 16> const& value) noexcept {
            ident_inc();
            write_raw("{\n");
            pad();
            for (size_t i = 0; i < 16; i++) {
                write(value[i]);
                if (i % 4 == 3) {
                    write_raw("\n");
                    if (i == 15) {
                        ident_dec();
                    }
                    pad();
                } else {
                    write_raw(", ");
                }
            }
            write_raw("}");
        }